

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cc
# Opt level: O0

shared_ptr<event> __thiscall
event::parse(event *this,char *buf,size_t buf_len,bool require_exact_size)

{
  uint8_t *stream_00;
  size_t len_00;
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<event> sVar6;
  uint32_t crc;
  undefined1 local_58 [8];
  shared_ptr<event> event;
  event_type_t local_3d;
  uint32_t event_no;
  int iStack_38;
  uint8_t event_type;
  uint32_t len;
  uint8_t *pointer;
  uint8_t *stream;
  size_t sStack_20;
  bool require_exact_size_local;
  size_t buf_len_local;
  char *buf_local;
  
  _iStack_38 = (uint8_t *)buf;
  pointer = (uint8_t *)buf;
  stream._7_1_ = require_exact_size;
  sStack_20 = buf_len;
  buf_len_local = (size_t)buf;
  buf_local = (char *)this;
  bVar1 = anon_unknown.dwarf_197ce::consume_bytes<unsigned_int>
                    ((uint8_t *)buf,buf_len,(uint8_t **)&stack0xffffffffffffffc8,&event_no);
  if (bVar1) {
    bVar1 = anon_unknown.dwarf_197ce::consume_bytes<unsigned_char>
                      (pointer,sStack_20,(uint8_t **)&stack0xffffffffffffffc8,&local_3d);
    if (bVar1) {
      bVar1 = anon_unknown.dwarf_197ce::consume_bytes<unsigned_int>
                        (pointer,sStack_20,(uint8_t **)&stack0xffffffffffffffc8,
                         (uint *)((long)&event.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi + 4));
      if (bVar1) {
        anon_unknown.dwarf_197ce::create_event((anon_unknown_dwarf_197ce *)local_58,local_3d);
        bVar1 = std::operator==((shared_ptr<event> *)local_58,(nullptr_t)0x0);
        uVar3 = event_no;
        if (bVar1) {
          std::shared_ptr<event>::shared_ptr((shared_ptr<event> *)this,(nullptr_t)0x0);
        }
        else {
          peVar4 = std::__shared_ptr_access<event,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<event,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_58);
          peVar4->len = uVar3;
          peVar4 = std::__shared_ptr_access<event,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<event,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_58);
          peVar4->event_no =
               event.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
          peVar4 = std::__shared_ptr_access<event,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<event,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_58);
          iVar2 = (*peVar4->_vptr_event[5])(peVar4,_iStack_38,(ulong)event_no - 5);
          len_00 = sStack_20;
          stream_00 = pointer;
          _iStack_38 = (uint8_t *)CONCAT44(extraout_var,iVar2);
          if (_iStack_38 == (uint8_t *)0x0) {
            std::shared_ptr<event>::shared_ptr((shared_ptr<event> *)this,(nullptr_t)0x0);
          }
          else {
            peVar4 = std::__shared_ptr_access<event,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<event,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_58);
            bVar1 = anon_unknown.dwarf_197ce::consume_bytes<unsigned_int>
                              (stream_00,len_00,(uint8_t **)&stack0xffffffffffffffc8,&peVar4->crc32)
            ;
            if (bVar1) {
              uVar3 = xcrc32(pointer,(iStack_38 - (int)pointer) + -4,0);
              peVar4 = std::__shared_ptr_access<event,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<event,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_58);
              if (uVar3 == peVar4->crc32) {
                std::shared_ptr<event>::shared_ptr
                          ((shared_ptr<event> *)this,(shared_ptr<event> *)local_58);
              }
              else {
                fprintf(_stderr,"CRC checksum mismatch\n");
                std::shared_ptr<event>::shared_ptr((shared_ptr<event> *)this,(nullptr_t)0x0);
              }
            }
            else {
              std::shared_ptr<event>::shared_ptr((shared_ptr<event> *)this,(nullptr_t)0x0);
            }
          }
        }
        std::shared_ptr<event>::~shared_ptr((shared_ptr<event> *)local_58);
        _Var5._M_pi = extraout_RDX_02;
      }
      else {
        std::shared_ptr<event>::shared_ptr((shared_ptr<event> *)this,(nullptr_t)0x0);
        _Var5._M_pi = extraout_RDX_01;
      }
    }
    else {
      std::shared_ptr<event>::shared_ptr((shared_ptr<event> *)this,(nullptr_t)0x0);
      _Var5._M_pi = extraout_RDX_00;
    }
  }
  else {
    std::shared_ptr<event>::shared_ptr((shared_ptr<event> *)this,(nullptr_t)0x0);
    _Var5._M_pi = extraout_RDX;
  }
  sVar6.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
  sVar6.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<event>)sVar6.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<event> event::parse(const char* buf, size_t buf_len, bool require_exact_size/* = false*/)
{
	const std::uint8_t* stream = reinterpret_cast<const std::uint8_t*>(buf);
	const std::uint8_t* pointer = stream;

	std::uint32_t len;
	if (!consume_bytes(stream, buf_len, pointer, len))
		return nullptr;

	std::uint8_t event_type;
	if (!consume_bytes(stream, buf_len, pointer, event_type))
		return nullptr;

	std::uint32_t event_no;
	if (!consume_bytes(stream, buf_len, pointer, event_no))
		return nullptr;

	auto event = create_event(static_cast<event_type_t>(event_type));
	// Parsed event type is invalid or couldn't create event
	if (event == nullptr)
		return nullptr;
	
	event->len = len;
	event->event_no = event_no;

	pointer = event->parse_event_data(pointer, len - sizeof(event::event_no) - sizeof(event::event_type));
	// Could not succesfully parse event_data depending on event type
	if (pointer == nullptr)
		return nullptr;

	if (!consume_bytes(stream, buf_len, pointer, event->crc32))
		return nullptr;

	// Reported message length and parsed len do not match
	//if (require_exact_size && len != (pointer - stream) - sizeof(event::crc32) - sizeof(event::len))
	//	return nullptr;

	// CRC checksum mismatch
	auto crc = xcrc32(stream, (pointer - sizeof(event::crc32)) - stream, 0);
	if (crc != event->crc32) {
		fprintf(stderr, "CRC checksum mismatch\n");
		return nullptr;
	}

	// Data was exact, event could be created and crc matches - we're good to go
	return event;
}